

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::DictionaryFeatureType::set_allocated_int64keytype
          (DictionaryFeatureType *this,Int64FeatureType *int64keytype)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_KeyType(this);
  if (int64keytype != (Int64FeatureType *)0x0) {
    uVar1 = (int64keytype->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      int64keytype = (Int64FeatureType *)
                     google::protobuf::internal::GetOwnedMessageInternal
                               (message_arena,&int64keytype->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 1;
    (this->KeyType_).int64keytype_ = int64keytype;
  }
  return;
}

Assistant:

void DictionaryFeatureType::set_allocated_int64keytype(::CoreML::Specification::Int64FeatureType* int64keytype) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_KeyType();
  if (int64keytype) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::Int64FeatureType>::GetOwningArena(int64keytype);
    if (message_arena != submessage_arena) {
      int64keytype = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, int64keytype, submessage_arena);
    }
    set_has_int64keytype();
    KeyType_.int64keytype_ = int64keytype;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.DictionaryFeatureType.int64KeyType)
}